

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

bool __thiscall Jupiter::Socket::getBlockingMode(Socket *this)

{
  uint uVar1;
  
  uVar1 = fcntl(this->m_data->rawSock,3,0);
  return (uVar1 >> 0xb & 1) == 0;
}

Assistant:

bool Jupiter::Socket::getBlockingMode() const {
#if defined _WIN32
	return !m_data->blockMode;
#else // _WIN32
	int flags = fcntl(m_data->rawSock, F_GETFL, 0);
	if (flags == -1) return false;
	return !(flags & O_NONBLOCK);
#endif
}